

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_send_pdu(rtr_socket *rtr_socket,void *pdu,uint len)

{
  tr_socket *socket;
  long lVar1;
  int iVar2;
  ulong __n;
  char *frmt;
  undefined1 *__dest;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __n = (ulong)len;
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __dest = auStack_38 + lVar1;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10ade5;
  memcpy(__dest,pdu,__n);
  iVar3 = 0;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10adf2;
  rtr_pdu_convert_footer_byte_order(__dest,TO_NETWORK_BYTE_ORDER);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10adfc;
  rtr_pdu_convert_header_byte_order(__dest,TO_NETWORK_BYTE_ORDER);
  if (rtr_socket->state != RTR_SHUTDOWN) {
    socket = rtr_socket->tr_socket;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10ae16;
    iVar2 = tr_send_all(socket,__dest,__n,0x3c);
    if (0 < iVar2) goto LAB_0010ae3c;
    frmt = "RTR Socket: Error sending PDU";
    if (iVar2 == -2) {
      frmt = "RTR Socket: send would block";
    }
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10ae36;
    lrtr_dbg(frmt);
  }
  iVar3 = -1;
LAB_0010ae3c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar3;
  }
  *(code **)((long)&uStack_40 + lVar1) = rtr_send_reset_query;
  __stack_chk_fail();
}

Assistant:

static int rtr_send_pdu(const struct rtr_socket *rtr_socket, const void *pdu, const unsigned int len)
{
	char pdu_converted[len];

	memcpy(pdu_converted, pdu, len);
	rtr_pdu_to_network_byte_order(pdu_converted);
	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	const int rtval = tr_send_all(rtr_socket->tr_socket, pdu_converted, len, RTR_SEND_TIMEOUT);

	if (rtval > 0)
		return RTR_SUCCESS;
	if (rtval == TR_WOULDBLOCK) {
		RTR_DBG1("send would block");
		return RTR_ERROR;
	}

	RTR_DBG1("Error sending PDU");
	return RTR_ERROR;
}